

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O1

void __thiscall
TPZDohrSubstructCondense<double>::Print(TPZDohrSubstructCondense<double> *this,ostream *out)

{
  TPZMatRed<double,_TPZFMatrix<double>_> *pTVar1;
  long *plVar2;
  TPZVec<int> *pTVar3;
  ostream *poVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (out,
             "void TPZDohrSubstructCondense<double>::Print(std::ostream &) const [TVar = double]",
             0x52);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"fNEquations ",0xc);
  plVar2 = (long *)std::ostream::operator<<(out,this->fNEquations);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"fNumInternalEquations ",0x16);
  plVar2 = (long *)std::ostream::operator<<(out,this->fNumInternalEquations);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"fNumExternalEquations ",0x16);
  plVar2 = (long *)std::ostream::operator<<(out,this->fNumExternalEquations);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  pTVar3 = GatherVec(this,Submesh,InternalFirst);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Internal equations-first-Gather ",0x20);
  poVar4 = ::operator<<(out,pTVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  pTVar3 = GatherVec(this,Submesh,ExternalFirst);
  std::__ostream_insert<char,std::char_traits<char>>(out,"External equations-first-Gather ",0x20);
  poVar4 = ::operator<<(out,pTVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"Numbering of the Coarse nodes in the global mesh fCoarseNodes ",0x3e);
  poVar4 = ::operator<<(out,&this->fCoarseNodes);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  pTVar1 = ((this->fMatRedComplete).fRef)->fPointer;
  (*(pTVar1->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x1c])
            (pTVar1,"The matrix which computes phi and fKCi ",out,2);
  pTVar1 = ((this->fMatRed).fRef)->fPointer;
  (*(pTVar1->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x1c])
            (pTVar1,"The matrix with the internal nodes condensed ",out);
  TPZMatrix<double>::Print
            (&(this->fKCi).super_TPZMatrix<double>,"Coarse Matrix fKCi",out,EFormatted);
  TPZMatrix<double>::Print(&(this->fPhiC).super_TPZMatrix<double>,"fPhiC : ",out,EMathematicaInput);
  std::__ostream_insert<char,std::char_traits<char>>(out,"fWeights = ",0xb);
  poVar4 = ::operator<<(out,&(this->fWeights).super_TPZVec<double>);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  TPZMatrix<double>::Print
            (&(this->fPhiC_Weighted_Condensed).super_TPZMatrix<double>,"fPhiC_Weighted_Condensed",
             out,EFormatted);
  TPZMatrix<double>::Print(&(this->fLocalLoad).super_TPZMatrix<double>,"fLocalLoad ",out,EFormatted)
  ;
  TPZMatrix<double>::Print
            (&(this->fLocalWeightedResidual).super_TPZMatrix<double>,"fLocalWeightedResidual ",out,
             EFormatted);
  TPZMatrix<double>::Print
            (&(this->fAdjustSolution).super_TPZMatrix<double>,"fAdjustSolution",out,EFormatted);
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::Print(std::ostream &out) const
{
	out << __PRETTY_FUNCTION__ << std::endl;
	out << "fNEquations " << fNEquations << std::endl;
	out << "fNumInternalEquations " << fNumInternalEquations << std::endl;
	out << "fNumExternalEquations " << fNumExternalEquations << std::endl;
	const TPZVec<int> &internaleq = GatherVec(Submesh, InternalFirst);
	out << "Internal equations-first-Gather " << internaleq << std::endl;
	const TPZVec<int> &exteq = GatherVec(Submesh, ExternalFirst);
	out << "External equations-first-Gather " << exteq << std::endl;
	out << "Numbering of the Coarse nodes in the global mesh fCoarseNodes " << fCoarseNodes << std::endl;
	fMatRedComplete->Print("The matrix which computes phi and fKCi ",out,EMathematicaInput);
	fMatRed->Print("The matrix with the internal nodes condensed ", out,EMathematicaInput);
	fKCi.Print("Coarse Matrix fKCi",out);
	fPhiC.Print("fPhiC : ",out,EMathematicaInput);
	out << "fWeights = " << fWeights  << endl;
	fPhiC_Weighted_Condensed.Print("fPhiC_Weighted_Condensed", out);
	fLocalLoad.Print("fLocalLoad ", out);
	fLocalWeightedResidual.Print("fLocalWeightedResidual ", out);
	fAdjustSolution.Print("fAdjustSolution", out);
}